

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O3

void __thiscall
agge::tests::QuadraticBezierCurveTests::
QBezierIteratorProducesExpectedVerticesAccordinglyToParameters(QuadraticBezierCurveTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FailedAssertion *pFVar3;
  long lVar4;
  qbezier b2;
  qbezier b1;
  undefined1 local_298 [8];
  undefined4 local_290;
  undefined8 local_28c;
  undefined4 local_284;
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_274;
  undefined4 local_26c;
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined4 local_254;
  undefined1 local_248 [44];
  int local_21c;
  pointer local_218;
  int local_210;
  pointer local_20c;
  int local_204;
  LocationInfo local_200;
  point local_1d8;
  undefined8 local_1cc;
  undefined4 local_1c4;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b4;
  undefined4 local_1ac;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined8 local_19c;
  undefined4 local_194;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_184;
  undefined4 local_17c;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_16c;
  undefined4 local_164;
  undefined8 local_160;
  undefined4 local_158;
  undefined8 local_154;
  undefined4 local_14c;
  point local_148;
  real_t local_13c;
  real_t rStack_138;
  int local_134;
  point local_130;
  point local_124;
  point local_118;
  point local_10c;
  point local_100;
  point local_f4;
  point local_e8;
  point local_dc;
  point local_d0;
  point local_c4;
  string local_b8;
  string local_98;
  qbezier local_78;
  qbezier local_54;
  
  qbezier::qbezier(&local_54,-3.5,7.4,1.0,2.0,10.1,3.8,0.111);
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_148.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_148.x = local_1d8.x;
  local_148.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_134 = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_13c = local_1d8.x;
  rStack_138 = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_130.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_130.x = local_1d8.x;
  local_130.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_124.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_124.x = local_1d8.x;
  local_124.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_118.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_118.x = local_1d8.x;
  local_118.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_10c.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_10c.x = local_1d8.x;
  local_10c.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_100.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_100.x = local_1d8.x;
  local_100.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_f4.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_f4.x = local_1d8.x;
  local_f4.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_e8.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_e8.x = local_1d8.x;
  local_e8.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_dc.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_dc.x = local_1d8.x;
  local_dc.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_d0.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_d0.x = local_1d8.x;
  local_d0.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_c4.command = qbezier::vertex(&local_54,&local_1d8.x,&local_1d8.y);
  local_c4.x = local_1d8.x;
  local_c4.y = local_1d8.y;
  local_1d8.x = -3.5;
  local_1d8.y = 7.4;
  local_1d8.command = 1;
  local_1cc = 0x40c946f3c01c6fcc;
  local_1c4 = 2;
  local_1c0 = 0x40ab6e8dbfa33cd2;
  local_1b8 = 2;
  local_1b4 = 0x409343973be84e00;
  local_1ac = 2;
  local_1a8 = 0x4080c6133fb38fcc;
  local_1a0 = 2;
  local_19c = 0x4067ec03403a5cd2;
  local_194 = 2;
  local_190 = 0x4059a6c240911975;
  local_188 = 2;
  local_184 = 0x4056bc6540c8a51a;
  local_17c = 2;
  local_178 = 0x405f2ceb4101e8aa;
  local_170 = 2;
  local_16c = 0x4072f85641214f13;
  local_164 = 2;
  local_160 = 0x407333334121999a;
  local_158 = 2;
  local_154 = 0;
  local_14c = 0;
  paVar1 = &local_200.filename.field_2;
  local_200.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_248,&local_200.filename,0x73);
  lVar4 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_1d8.x + lVar4),(point *)((long)&local_148.x + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_298 = (undefined1  [8])((long)&local_28c + 4);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,(string *)local_298,(LocationInfo *)local_248);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x90);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_200.filename._M_dataplus._M_p);
  }
  qbezier::qbezier(&local_78,1.0,1.0,0.0,0.0,-1.0,1.0,0.3);
  local_290 = 0;
  local_298 = (undefined1  [8])0x0;
  local_248._8_4_ = qbezier::vertex(&local_78,(real_t *)local_298,(real_t *)(local_298 + 4));
  local_248._0_8_ = local_298;
  local_290 = 0;
  local_298 = (undefined1  [8])0x0;
  local_248._20_4_ = qbezier::vertex(&local_78,(real_t *)local_298,(real_t *)(local_298 + 4));
  local_248._12_8_ = local_298;
  local_290 = 0;
  local_298 = (undefined1  [8])0x0;
  local_248._32_4_ = qbezier::vertex(&local_78,(real_t *)local_298,(real_t *)(local_298 + 4));
  local_248._24_8_ = local_298;
  local_290 = 0;
  local_298 = (undefined1  [8])0x0;
  local_21c = qbezier::vertex(&local_78,(real_t *)local_298,(real_t *)(local_298 + 4));
  local_248._36_8_ = local_298;
  local_290 = 0;
  local_298 = (undefined1  [8])0x0;
  local_210 = qbezier::vertex(&local_78,(real_t *)local_298,(real_t *)(local_298 + 4));
  local_218 = (pointer)local_298;
  local_290 = 0;
  local_298 = (undefined1  [8])0x0;
  local_204 = qbezier::vertex(&local_78,(real_t *)local_298,(real_t *)(local_298 + 4));
  local_20c = (pointer)local_298;
  local_298 = (undefined1  [8])0x3f8000003f800000;
  local_290 = 1;
  local_28c = 0x3f147ae13ecccccc;
  local_284 = 2;
  local_280 = 0x3f051eb8be4ccccf;
  local_278 = 2;
  local_274 = 0x3f51eb86bf4cccce;
  local_26c = 2;
  local_268 = 0x3f800000bf800000;
  local_260 = 2;
  local_25c = 0;
  local_254 = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_200,&local_b8,0x87);
  lVar4 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)(local_298 + lVar4),(point *)(local_248 + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,&local_98,&local_200);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_200.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( QBezierIteratorProducesExpectedVerticesAccordinglyToParameters )
			{
				// INIT
				qbezier b1(-3.5f, 7.4f, 1.0f, 2.0f, 10.1f, 3.8f, 0.111f);

				// ACT
				mocks::path::point points1[] = {
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(-3.50000000f, 7.40000010f),
					lineto(-2.44432354f, 6.28991079f),
					lineto(-1.27529359f, 5.35724497f),
					lineto(0.00708937645f, 4.60200071f),
					lineto(1.40282583f, 4.02417898f),
					lineto(2.91191530f, 3.62378001f),
					lineto(4.53435755f, 3.40080309f),
					lineto(6.27015400f, 3.35524869f),
					lineto(8.11930275f, 3.48711658f),
					lineto(10.0818052f, 3.79640722f),
					lineto(10.1000004f, 3.79999995f),
					stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(1.0f, 1.0f, 0.0f, 0.0f, -1.0f, 1.0f, 0.3f);

				// ACT
				mocks::path::point points2[] = {
					vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.00000000f, 1.00000000f),
					lineto(0.399999976f, 0.579999983f),
					lineto(-0.200000033f, 0.519999981f),
					lineto(-0.800000072f, 0.820000052f),
					lineto(-1.00000000f, 1.00000000f),
					stop(),
				};

				assert_equal(reference2, points2);
			}